

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexBindingBufferCase::test
          (VertexBindingBufferCase *this,ResultCollector *result)

{
  deUint32 *this_00;
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  Enum<int,_2UL> EVar6;
  GLuint local_5dc;
  undefined1 local_5d8 [4];
  GLuint otherBuffer_1;
  VertexArray otherVao_1;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  ScopedLogSection local_570;
  ScopedLogSection section_2;
  TestLog *local_558;
  int local_550;
  string local_548;
  allocator<char> local_521;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  GLenum local_49c;
  GetNameFunc p_Stack_498;
  deUint32 err_4;
  int local_490;
  GetNameFunc local_488;
  int local_480;
  string local_478;
  allocator<char> local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  GLenum local_3cc;
  GetNameFunc p_Stack_3c8;
  deUint32 err_3;
  int local_3c0;
  GetNameFunc local_3b8;
  int local_3b0;
  string local_3a8;
  allocator<char> local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  GLenum local_2fc;
  GetNameFunc p_Stack_2f8;
  deUint32 err_2;
  int local_2f0;
  GetNameFunc local_2e8;
  int local_2e0;
  string local_2d8;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  GLenum local_22c;
  undefined1 local_228 [4];
  deUint32 err_1;
  Buffer otherBuffer;
  VertexArray otherVao;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  ScopedLogSection local_1a8;
  ScopedLogSection section_1;
  int binding;
  allocator<char> local_171;
  string local_170;
  ScopedLogSection local_150;
  ScopedLogSection section;
  TestLog *local_138;
  int local_130;
  string local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  GLenum local_7c;
  int local_78;
  deUint32 err;
  GLint maxBindings;
  GLint reportedMaxBindings;
  Buffer buffer;
  undefined1 local_48 [8];
  VertexArray vao;
  CallLogWrapper gl;
  ResultCollector *result_local;
  VertexBindingBufferCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48,pRVar4);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&maxBindings,pRVar4);
  err = 0xffffffff;
  this_00 = &vao.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)this_00,dVar2);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82da,(GLint *)&err);
  do {
    local_7c = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    if (local_7c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Got Error ",&local_101);
      EVar6 = glu::getErrorStr(local_7c);
      section.m_log = (TestLog *)EVar6.m_getName;
      local_130 = EVar6.m_value;
      local_138 = section.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_128,&local_138);
      std::operator+(&local_e0,&local_100,&local_128);
      std::operator+(&local_c0,&local_e0,": ");
      std::operator+(&local_a0,&local_c0,"glGetIntegerv");
      tcu::ResultCollector::fail(result,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  local_78 = de::max<int>(0x10,err);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"initial",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&binding,"Initial values",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_150,pTVar5,&local_170,(string *)&binding);
  std::__cxx11::string::~string((string *)&binding);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  for (section_1.m_log._0_4_ = 0; (int)section_1.m_log < local_78;
      section_1.m_log._0_4_ = (int)section_1.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x8f4f,
               (int)section_1.m_log,0,(this->super_IndexedCase).m_verifier);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_150);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"vao",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"VAO state",
             (allocator<char> *)&otherVao.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_1a8,pTVar5,&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&otherVao.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&otherBuffer.super_ObjectWrapper.m_object,
             pRVar4);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_228,pRVar4);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&maxBindings);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,dVar2,0,0x20);
  do {
    local_22c = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_22c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"Got Error ",&local_2b1);
      EVar6 = glu::getErrorStr(local_22c);
      p_Stack_2f8 = EVar6.m_getName;
      local_2f0 = EVar6.m_value;
      local_2e8 = p_Stack_2f8;
      local_2e0 = local_2f0;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2d8,&local_2e8);
      std::operator+(&local_290,&local_2b0,&local_2d8);
      std::operator+(&local_270,&local_290,": ");
      std::operator+(&local_250,&local_270,"glBindVertexBuffer");
      tcu::ResultCollector::fail(result,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&otherBuffer.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  do {
    local_2fc = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_2fc != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"Got Error ",&local_381);
      EVar6 = glu::getErrorStr(local_2fc);
      p_Stack_3c8 = EVar6.m_getName;
      local_3c0 = EVar6.m_value;
      local_3b8 = p_Stack_3c8;
      local_3b0 = local_3c0;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3a8,&local_3b8);
      std::operator+(&local_360,&local_380,&local_3a8);
      std::operator+(&local_340,&local_360,": ");
      std::operator+(&local_320,&local_340,"glBindVertexArray");
      tcu::ResultCollector::fail(result,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_228);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,dVar2,0,0x20);
  do {
    local_3cc = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_3cc != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"Got Error ",&local_451);
      EVar6 = glu::getErrorStr(local_3cc);
      p_Stack_498 = EVar6.m_getName;
      local_490 = EVar6.m_value;
      local_488 = p_Stack_498;
      local_480 = local_490;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_478,&local_488);
      std::operator+(&local_430,&local_450,&local_478);
      std::operator+(&local_410,&local_430,": ");
      std::operator+(&local_3f0,&local_410,"glBindVertexBuffer");
      tcu::ResultCollector::fail(result,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  do {
    local_49c = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_49c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,"Got Error ",&local_521);
      EVar6 = glu::getErrorStr(local_49c);
      section_2.m_log = (TestLog *)EVar6.m_getName;
      local_550 = EVar6.m_value;
      local_558 = section_2.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_548,&local_558);
      std::operator+(&local_500,&local_520,&local_548);
      std::operator+(&local_4e0,&local_500,": ");
      std::operator+(&local_4c0,&local_4e0,"glBindVertexArray");
      tcu::ResultCollector::fail(result,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator(&local_521);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&maxBindings);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x8f4f,1,dVar2,
             (this->super_IndexedCase).m_verifier);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_228);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&otherBuffer.super_ObjectWrapper.m_object);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1a8);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"autoUnbind",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"Unbind on delete",
             (allocator<char> *)&otherVao_1.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_570,pTVar5,&local_590,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&otherVao_1.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_5d8,pRVar4);
  local_5dc = 0xffffffff;
  glu::CallLogWrapper::glGenBuffers
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,&local_5dc);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,local_5dc,0,0x20);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_5d8);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,local_5dc,0,0x20);
  glu::CallLogWrapper::glDeleteBuffers
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,&local_5dc);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x8f4f,1,0,
             (this->super_IndexedCase).m_verifier);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x8f4f,1,local_5dc,
             (this->super_IndexedCase).m_verifier);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_5d8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_570);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&maxBindings);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void VertexBindingBufferCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());
	glu::Buffer			buffer				(m_context.getRenderContext());
	glw::GLint			reportedMaxBindings	= -1;
	glw::GLint			maxBindings;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &reportedMaxBindings);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	maxBindings = de::max(16, reportedMaxBindings);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int binding = 0; binding < maxBindings; ++binding)
			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, binding, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());
		glu::Buffer					otherBuffer		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glBindVertexBuffer(1, *buffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");
		gl.glBindVertexBuffer(1, *otherBuffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, *buffer, m_verifier);
	}

	// Is detached in delete from active vao and not from deactive
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "autoUnbind", "Unbind on delete");
		glu::VertexArray			otherVao		(m_context.getRenderContext());
		glw::GLuint					otherBuffer		= -1;

		gl.glGenBuffers(1, &otherBuffer);

		// set in vao1 and vao2
		gl.glBindVertexBuffer(1, otherBuffer, 0, 32);
		gl.glBindVertexArray(*otherVao);
		gl.glBindVertexBuffer(1, otherBuffer, 0, 32);

		// delete buffer. This unbinds it from active (vao2) but not from unactive
		gl.glDeleteBuffers(1, &otherBuffer);
		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, 0, m_verifier);

		gl.glBindVertexArray(*vao);
		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, otherBuffer, m_verifier);
	}
}